

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O1

BigInteger * __thiscall BigInteger::operator+=(BigInteger *this,BigInteger *a)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  BigInteger *pBVar4;
  uint uVar5;
  compare_t cVar6;
  uint uVar7;
  ulong in_RAX;
  ulong uVar8;
  pointer puVar9;
  ulong uVar10;
  iterator iVar11;
  ulong uVar12;
  ulong uVar13;
  BigInteger *pBVar14;
  undefined8 local_38;
  
  local_38 = in_RAX;
  if (this->negative == a->negative) {
    iVar11._M_current =
         (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    uVar8 = (long)iVar11._M_current -
            (long)(this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (3 < ((long)(a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start | uVar8)) {
      uVar8 = (long)uVar8 >> 2;
      uVar12 = 0;
      uVar13 = 0;
      do {
        if (uVar8 <= uVar13) {
          local_38 = local_38 & 0xffffffff;
          if (iVar11._M_current ==
              (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(&this->digits,iVar11,(uint *)((long)&local_38 + 4));
          }
          else {
            *iVar11._M_current = 0;
            (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar11._M_current + 1;
          }
        }
        puVar2 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar3 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar5 = 0;
        if (uVar13 < (ulong)((long)(a->digits).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2)) {
          uVar5 = puVar3[uVar13];
        }
        uVar5 = puVar2[uVar13] + (int)uVar12 + uVar5;
        uVar8 = (ulong)(uVar5 >> 9) * 0x44b83;
        uVar12 = uVar8 >> 0x27;
        puVar2[uVar13] = uVar5 + (uint)(uVar8 >> 0x27) * -1000000000;
        uVar13 = uVar13 + 1;
        uVar10 = (long)(a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        iVar11._M_current =
             (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        uVar8 = (long)iVar11._M_current -
                (long)(this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2;
        if (uVar10 <= uVar8) {
          uVar10 = uVar8;
        }
      } while ((uVar13 < uVar10) || (999999999 < uVar5));
    }
  }
  else {
    cVar6 = _compareAbs(this,a);
    pBVar14 = a;
    pBVar4 = this;
    if (cVar6 < CMP_EQUAL) {
      pBVar14 = this;
      pBVar4 = a;
    }
    this->negative = pBVar4->negative;
    if ((a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar5 = 0;
      uVar8 = 0;
      do {
        iVar11._M_current =
             (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if ((ulong)((long)iVar11._M_current -
                    (long)(this->digits).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= uVar8) {
          local_38 = local_38 & 0xffffffff00000000;
          if (iVar11._M_current ==
              (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(&this->digits,iVar11,(uint *)&local_38);
          }
          else {
            *iVar11._M_current = 0;
            (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar11._M_current + 1;
          }
        }
        puVar2 = (pBVar14->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar7 = 0;
        if (uVar8 < (ulong)((long)(pBVar14->digits).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2)) {
          uVar7 = puVar2[uVar8];
        }
        uVar7 = uVar7 + uVar5;
        uVar1 = (pBVar4->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar8];
        uVar5 = (uVar1 - uVar7) + 1000000000;
        if (uVar7 <= uVar1) {
          uVar5 = uVar1 - uVar7;
        }
        (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] = uVar5;
        uVar8 = uVar8 + 1;
        uVar5 = (uint)(uVar1 < uVar7);
      } while ((uVar1 < uVar7) ||
              (uVar8 < (ulong)((long)(a->digits).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(a->digits).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2)));
    }
  }
  puVar2 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while ((puVar3 != puVar2 && (puVar9 = puVar3 + -1, *puVar9 == 0))) {
    (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar9;
    puVar3 = puVar9;
  }
  if (puVar2 == puVar3) {
    this->negative = false;
  }
  return this;
}

Assistant:

BigInteger &BigInteger::operator+=(const BigInteger &a) noexcept
{
    bool sub = negative ^a.negative;
    int rem = 0;
    if(!sub)  // addition
    {
        for(size_t i = 0; i < std::max(a.digits.size(), digits.size()) || rem; ++i)
        {
            if(digits.size() <= i)
                digits.push_back(0);
            digits[i] = digits[i] + (a.digits.size() > i ? a.digits[i] : 0) + rem;
            rem = digits[i] / BLOCK_MOD;
            digits[i] %= BLOCK_MOD;
        }
    }
    else
    {
        bool rev = _compareAbs(a) < 0;
        const BigInteger &big = (rev ? a : *this), &small = (rev ? *this : a);
        negative = big.negative;
        for(size_t i = 0; i < a.digits.size() || rem; ++i)
        {
            if(digits.size() <= i)
                digits.push_back(0);
            unsigned dig = (small.digits.size() > i ? small.digits[i] : 0);
            if(big.digits[i] >= dig + rem)
            {
                digits[i] = big.digits[i] - dig - rem;
                rem = 0;
            }
            else
            {
                digits[i] = BLOCK_MOD + big.digits[i] - dig - rem;
                rem = 1;
            }
        }
    }
    normalize();
    return *this;
}